

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

size_type __thiscall boost::filesystem::path::m_parent_path_end(path *this)

{
  long lVar1;
  size_type size;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  bool bVar5;
  
  size = anon_unknown.dwarf_1dc47::filename_pos
                   (&this->m_pathname,(this->m_pathname)._M_string_length);
  if ((this->m_pathname)._M_string_length == 0) {
    bVar5 = true;
  }
  else {
    bVar5 = (this->m_pathname)._M_dataplus._M_p[size] != '/';
  }
  sVar2 = anon_unknown.dwarf_1dc47::root_directory_start(&this->m_pathname,size);
  sVar3 = size + 1;
  while (sVar3 != 1) {
    sVar4 = sVar2 + 1;
    if ((sVar3 - sVar2 == 2) ||
       (sVar4 = sVar3 - 1, lVar1 = sVar3 - 2, sVar3 = sVar4,
       (this->m_pathname)._M_dataplus._M_p[lVar1] != '/')) goto LAB_0010f4e2;
  }
  sVar4 = 0;
LAB_0010f4e2:
  sVar3 = 0xffffffffffffffff;
  if (sVar2 != 0 || sVar4 != 1) {
    sVar3 = sVar4;
  }
  if (bVar5) {
    sVar3 = sVar4;
  }
  return sVar3;
}

Assistant:

string_type::size_type path::m_parent_path_end() const
  {
    size_type end_pos(filename_pos(m_pathname, m_pathname.size()));

    bool filename_was_separator(m_pathname.size()
      && is_separator(m_pathname[end_pos]));

    // skip separators unless root directory
    size_type root_dir_pos(root_directory_start(m_pathname, end_pos));
    for (; 
      end_pos > 0
      && (end_pos-1) != root_dir_pos
      && is_separator(m_pathname[end_pos-1])
      ;
      --end_pos) {}

   return (end_pos == 1 && root_dir_pos == 0 && filename_was_separator)
     ? string_type::npos
     : end_pos;
  }